

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O2

void __thiscall FShaderManager::CompileShaders(FShaderManager *this)

{
  TArray<FShader_*,_FShader_*> *this_00;
  char *pcVar1;
  char *ShaderPath;
  bool bVar2;
  long lVar3;
  FShader *this_01;
  int i;
  ulong uVar4;
  FShaderManager *pFVar5;
  char **ppcVar6;
  FShader *shc_1;
  FShader *shc;
  FName sfn;
  
  this->mActiveShader = (FShader *)0x0;
  TArray<FShader_*,_FShader_*>::Clear(&this->mTextureEffects);
  this_00 = &this->mTextureEffectsNAT;
  pFVar5 = (FShaderManager *)this_00;
  TArray<FShader_*,_FShader_*>::Clear(this_00);
  for (lVar3 = 5; lVar3 != 9; lVar3 = lVar3 + 1) {
    this->mEffectShaders[lVar3 + -5] = (FShader *)0x0;
  }
  ppcVar6 = &defaultshaders[0].gettexelfunc;
  for (uVar4 = 0; uVar4 != 0xc; uVar4 = uVar4 + 1) {
    pcVar1 = ((FDefaultShader *)(ppcVar6 + -1))->ShaderName;
    ShaderPath = *ppcVar6;
    shc = Compile(pFVar5,pcVar1,ShaderPath,true);
    pFVar5 = this;
    TArray<FShader_*,_FShader_*>::Push(&this->mTextureEffects,&shc);
    if (uVar4 < 4) {
      shc_1 = Compile(pFVar5,pcVar1,ShaderPath,false);
      pFVar5 = (FShaderManager *)this_00;
      TArray<FShader_*,_FShader_*>::Push(this_00,&shc_1);
    }
    ppcVar6 = ppcVar6 + 2;
  }
  for (uVar4 = 0; uVar4 < usershaders.Count; uVar4 = uVar4 + 1) {
    ExtractFileBase((char *)&shc,SUB81(usershaders.Array[uVar4].Chars,0));
    pFVar5 = (FShaderManager *)&sfn;
    FName::FName((FName *)pFVar5,(FString *)&shc);
    shc_1 = Compile(pFVar5,FName::NameData.NameArray[sfn.Index].Text,usershaders.Array[uVar4].Chars,
                    true);
    TArray<FShader_*,_FShader_*>::Push(&this->mTextureEffects,&shc_1);
    FString::~FString((FString *)&shc);
  }
  ppcVar6 = &effectshaders[0].defines;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    this_01 = (FShader *)operator_new(0x110);
    pcVar1 = ((FEffectShader *)(ppcVar6 + -4))->ShaderName;
    FShader::FShader(this_01,pcVar1);
    bVar2 = FShader::Load(this_01,pcVar1,"shaders/glsl/main.vp",ppcVar6[-2],ppcVar6[-1],*ppcVar6);
    if (bVar2) {
      this->mEffectShaders[lVar3] = this_01;
    }
    else {
      FShader::~FShader(this_01);
      operator_delete(this_01,0x110);
    }
    ppcVar6 = ppcVar6 + 5;
  }
  return;
}

Assistant:

void FShaderManager::CompileShaders()
{
	mActiveShader = NULL;

	mTextureEffects.Clear();
	mTextureEffectsNAT.Clear();
	for (int i = 0; i < MAX_EFFECTS; i++)
	{
		mEffectShaders[i] = NULL;
	}

	for(int i=0;defaultshaders[i].ShaderName != NULL;i++)
	{
		FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, true);
		mTextureEffects.Push(shc);
		if (i <= 3)
		{
			FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, false);
			mTextureEffectsNAT.Push(shc);
		}
	}

	for(unsigned i = 0; i < usershaders.Size(); i++)
	{
		FString name = ExtractFileBase(usershaders[i]);
		FName sfn = name;

		FShader *shc = Compile(sfn, usershaders[i], true);
		mTextureEffects.Push(shc);
	}

	for(int i=0;i<MAX_EFFECTS;i++)
	{
		FShader *eff = new FShader(effectshaders[i].ShaderName);
		if (!eff->Load(effectshaders[i].ShaderName, effectshaders[i].vp, effectshaders[i].fp1,
						effectshaders[i].fp2, effectshaders[i].defines))
		{
			delete eff;
		}
		else mEffectShaders[i] = eff;
	}
}